

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

void gray_render_conic(PWorker worker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  bool bVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  PVG_FT_Vector bez_stack [33];
  long local_228 [66];
  
  local_228[0] = to->x * 4;
  local_228[1] = to->y * 4;
  local_228[2] = control->x * 4;
  lVar8 = control->y;
  local_228[3] = lVar8 * 4;
  local_228[4] = worker->x;
  local_228[5] = worker->y;
  lVar11 = to->y >> 6;
  lVar10 = worker->max_ey;
  if (((lVar11 < lVar10) || (local_228[5] >> 8 < lVar10 || lVar8 >> 6 < lVar10)) &&
     (lVar10 = worker->min_ey,
     lVar10 <= local_228[5] >> 8 || (lVar10 <= lVar8 >> 6 || lVar10 <= lVar11))) {
    uVar6 = local_228[0] + control->x * -8 + worker->x;
    uVar9 = -uVar6;
    if (0 < (long)uVar6) {
      uVar9 = uVar6;
    }
    uVar2 = local_228[1] + lVar8 * -8 + local_228[5];
    uVar6 = -uVar2;
    if (0 < (long)uVar2) {
      uVar6 = uVar2;
    }
    if (uVar6 < uVar9) {
      uVar6 = uVar9;
    }
    uVar7 = 1;
    plVar3 = local_228;
    if (0x40 < uVar6) {
      do {
        uVar7 = uVar7 * 2;
        bVar1 = 0x103 < uVar6;
        plVar3 = local_228;
        uVar6 = uVar6 >> 2;
      } while (bVar1);
    }
    do {
      if ((uVar7 & 1) == 0) {
        uVar5 = 1;
        plVar4 = plVar3;
        do {
          plVar4[8] = plVar4[4];
          lVar10 = (plVar4[4] + plVar4[2]) / 2;
          plVar4[6] = lVar10;
          plVar3 = plVar4 + 4;
          lVar8 = (plVar4[2] + *plVar4) / 2;
          plVar4[2] = lVar8;
          plVar4[4] = (lVar8 + lVar10) / 2;
          plVar4[9] = plVar4[5];
          lVar10 = (plVar4[5] + plVar4[3]) / 2;
          plVar4[7] = lVar10;
          lVar8 = (plVar4[3] + plVar4[1]) / 2;
          plVar4[3] = lVar8;
          plVar4[5] = (lVar8 + lVar10) / 2;
          uVar5 = uVar5 * 2;
          plVar4 = plVar3;
        } while ((uVar5 & uVar7) == 0);
      }
      gray_render_line(worker,*plVar3,plVar3[1]);
      uVar7 = uVar7 - 1;
      plVar3 = plVar3 + -4;
    } while (uVar7 != 0);
  }
  else {
    worker->x = local_228[0];
    worker->y = local_228[1];
  }
  return;
}

Assistant:

static void
  gray_render_conic( RAS_ARG_ const PVG_FT_Vector*  control,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 2 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    TPos        dx, dy;
    int         draw, split;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control->x );
    arc[1].y = UPSCALE( control->y );
    arc[2].x = ras.x;
    arc[2].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    dx = PVG_FT_ABS( arc[2].x + arc[0].x - 2 * arc[1].x );
    dy = PVG_FT_ABS( arc[2].y + arc[0].y - 2 * arc[1].y );
    if ( dx < dy )
      dx = dy;

    /* We can calculate the number of necessary bisections because  */
    /* each bisection predictably reduces deviation exactly 4-fold. */
    /* Even 32-bit deviation would vanish after 16 bisections.      */
    draw = 1;
    while ( dx > ONE_PIXEL / 4 )
    {
      dx >>= 2;
      draw <<= 1;
    }

    /* We use decrement counter to count the total number of segments */
    /* to draw starting from 2^level. Before each draw we split as    */
    /* many times as there are trailing zeros in the counter.         */
    do
    {
      split = 1;
      while ( ( draw & split ) == 0 )
      {
        gray_split_conic( arc );
        arc += 2;
        split <<= 1;
      }

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );
      arc -= 2;

    } while ( --draw );
  }